

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVector<char,_40UL>::SmallVector(SmallVector<char,_40UL> *this,Base *other)

{
  move_iterator<char_*> first;
  size_type sVar1;
  
  (this->super_SmallVectorBase<char>).data_ = (this->super_SmallVectorBase<char>).firstElement;
  (this->super_SmallVectorBase<char>).len = 0;
  (this->super_SmallVectorBase<char>).cap = 0;
  first._M_current = other->data_;
  if (first._M_current == other->firstElement) {
    (this->super_SmallVectorBase<char>).cap = 0x28;
    SmallVectorBase<char>::append<std::move_iterator<char_*>_>
              (&this->super_SmallVectorBase<char>,first,
               (move_iterator<char_*>)(first._M_current + other->len));
    other->len = 0;
  }
  else {
    other->data_ = (pointer)0x0;
    (this->super_SmallVectorBase<char>).data_ = first._M_current;
    sVar1 = other->len;
    other->len = 0;
    (this->super_SmallVectorBase<char>).len = sVar1;
    sVar1 = other->cap;
    other->cap = 0;
    (this->super_SmallVectorBase<char>).cap = sVar1;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }